

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_cat2(char *args)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  void *__ptr;
  long lVar7;
  void *__ptr_00;
  long lVar8;
  undefined8 uVar9;
  void *__ptr_01;
  long lVar10;
  void *__ptr_02;
  long local_48;
  long local_40;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar3 = strchr(args,0x22);
    if (pcVar3 == (char *)0x0) goto LAB_00104465;
  }
  else {
    pcVar3 = strchr(args,0x20);
  }
  *pcVar3 = '\0';
  if (pcVar3[1] == '\"') {
    pcVar3 = pcVar3 + 2;
    pcVar4 = strchr(pcVar3,0x22);
    if (pcVar4 == (char *)0x0) {
LAB_00104465:
      puts("missing string terminator in argument.");
      return 1;
    }
    *pcVar4 = '\0';
  }
  else {
    pcVar3 = pcVar3 + 1;
  }
  lVar5 = PHYSFS_openRead(args);
  if (lVar5 == 0) {
    uVar9 = PHYSFS_getLastError();
    printf("failed to open \'%s\'. Reason: [%s].\n",args,uVar9);
    return 1;
  }
  lVar6 = PHYSFS_openRead(pcVar3);
  if (lVar6 == 0) {
    uVar9 = PHYSFS_getLastError();
    printf("failed to open \'%s\'. Reason: [%s].\n",pcVar3,uVar9);
  }
  else {
    if (do_buffer_size != 0) {
      iVar2 = PHYSFS_setBuffer(lVar5);
      if (iVar2 == 0) {
        uVar9 = PHYSFS_getLastError();
      }
      else {
        iVar2 = PHYSFS_setBuffer(lVar6,do_buffer_size);
        if (iVar2 != 0) goto LAB_00104319;
        uVar9 = PHYSFS_getLastError();
        args = pcVar3;
      }
      printf("failed to set file buffer for \'%s\'. Reason: [%s].\n",args,uVar9);
      PHYSFS_close(lVar5);
      goto LAB_001045c0;
    }
LAB_00104319:
    local_40 = 0;
    local_48 = 0;
    __ptr_01 = (void *)0x0;
    __ptr_02 = (void *)0x0;
    lVar10 = local_48;
    lVar1 = local_40;
    do {
      local_40 = lVar1;
      local_48 = lVar10;
      __ptr = realloc(__ptr_01,local_40 + 0x80);
      if (__ptr == (void *)0x0) {
        puts("(Out of memory.)\n");
        free(__ptr_01);
        free(__ptr_02);
LAB_0010454c:
        PHYSFS_close(lVar5);
        goto LAB_001045c0;
      }
      lVar7 = PHYSFS_readBytes(lVar5,(long)__ptr + local_40,0x80);
      if (lVar7 < 0) {
        uVar9 = PHYSFS_getLastError();
        printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",args,uVar9);
        free(__ptr);
        free(__ptr_02);
        goto LAB_0010454c;
      }
      __ptr_00 = realloc(__ptr_02,local_48 + 0x80);
      if (__ptr_00 == (void *)0x0) {
        puts("(Out of memory.)\n");
        free(__ptr);
        free(__ptr_02);
        PHYSFS_close(lVar5);
        goto LAB_001045c0;
      }
      lVar8 = PHYSFS_readBytes(lVar6,(long)__ptr_00 + local_48,0x80);
      if (lVar8 < 0) {
        uVar9 = PHYSFS_getLastError();
        printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",pcVar3,uVar9);
        free(__ptr);
        free(__ptr_00);
        PHYSFS_close(lVar5);
        goto LAB_001045c0;
      }
      iVar2 = PHYSFS_eof(lVar5);
      __ptr_01 = __ptr;
      __ptr_02 = __ptr_00;
      lVar10 = lVar8 + local_48;
      lVar1 = lVar7 + local_40;
    } while ((iVar2 == 0) || (iVar2 = PHYSFS_eof(lVar6), iVar2 == 0));
    printf("file \'%s\' ...\n\n",args);
    for (lVar10 = 0; lVar7 + local_40 != lVar10; lVar10 = lVar10 + 1) {
      fputc((int)*(char *)((long)__ptr + lVar10),_stdout);
    }
    free(__ptr);
    printf("\n\nfile \'%s\' ...\n\n",pcVar3);
    for (lVar10 = 0; lVar8 + local_48 != lVar10; lVar10 = lVar10 + 1) {
      fputc((int)*(char *)((long)__ptr_00 + lVar10),_stdout);
    }
    free(__ptr_00);
    puts("\n");
  }
  PHYSFS_close(lVar5);
  if (lVar6 == 0) {
    return 1;
  }
LAB_001045c0:
  PHYSFS_close(lVar6);
  return 1;
}

Assistant:

static int cmd_cat2(char *args)
{
    PHYSFS_File *f1 = NULL;
    PHYSFS_File *f2 = NULL;
    char *fname1;
    char *fname2;
    char *ptr;

    fname1 = args;
    if (*fname1 == '\"')
    {
        fname1++;
        ptr = strchr(fname1, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(fname1, ' ');
        *ptr = '\0';
    } /* else */

    fname2 = ptr + 1;
    if (*fname2 == '\"')
    {
        fname2++;
        ptr = strchr(fname2, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if ((f1 = PHYSFS_openRead(fname1)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname1, PHYSFS_getLastError());
    else if ((f2 = PHYSFS_openRead(fname2)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname2, PHYSFS_getLastError());
    else
    {
        char *buffer1 = NULL;
        size_t buffer1len = 0;
        char *buffer2 = NULL;
        size_t buffer2len = 0;
        char *ptr = NULL;
        size_t i;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f1, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname1, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            else if (!PHYSFS_setBuffer(f2, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname2, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
        } /* if */


        do
        {
            int readlen = 128;
            PHYSFS_sint64 rc;

            ptr = realloc(buffer1, buffer1len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer1 = ptr;
            rc = PHYSFS_readBytes(f1, buffer1 + buffer1len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname1, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer1len += (size_t) rc;

            ptr = realloc(buffer2, buffer2len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer2 = ptr;
            rc = PHYSFS_readBytes(f2, buffer2 + buffer2len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname2, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer2len += (size_t) rc;
        } while (!PHYSFS_eof(f1) || !PHYSFS_eof(f2));

        printf("file '%s' ...\n\n", fname1);
        for (i = 0; i < buffer1len; i++)
            fputc((int) buffer1[i], stdout);
        free(buffer1);

        printf("\n\nfile '%s' ...\n\n", fname2);
        for (i = 0; i < buffer2len; i++)
            fputc((int) buffer2[i], stdout);
        free(buffer2);

        printf("\n\n");
    } /* else */

    if (f1)
        PHYSFS_close(f1);

    if (f2)
        PHYSFS_close(f2);

    return 1;
}